

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor.cpp
# Opt level: O0

void __thiscall booster::aio::base_poll_reactor::~base_poll_reactor(base_poll_reactor *this)

{
  reactor_impl *in_RDI;
  
  reactor_impl::~reactor_impl(in_RDI);
  return;
}

Assistant:

int to_poll_events(int event)
		{
			int pe=0;
			if(event & reactor::in)
				pe|=POLLIN;
			if(event & reactor::out)
				pe|=POLLOUT;
			return pe;
		}